

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O3

void Assimp::IFC::ProcessExtrudedArea
               (IfcExtrudedAreaSolid *solid,TempMesh *curve,IfcVector3 *extrusionDir,
               TempMesh *result,ConversionData *conv,bool collect_openings)

{
  pointer *ppuVar1;
  double dVar2;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvVar3;
  pointer pTVar4;
  element_type *peVar5;
  double *pdVar6;
  iterator iVar7;
  IfcVector3 *pIVar8;
  _Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter> __comp;
  IfcVector3 __comp_00;
  undefined4 uVar9;
  TempMesh *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar10;
  int iVar11;
  uint uVar12;
  IfcProfileDef *pIVar13;
  IfcAxis2Placement3D *in_00;
  IfcVector3 *pIVar14;
  ulong uVar15;
  pointer paVar16;
  byte bVar17;
  bool bVar18;
  IfcVector3 *pIVar19;
  aiVector3t<double> *paVar20;
  pointer *ppaVar21;
  pointer *ppaVar22;
  long lVar23;
  iterator iVar24;
  undefined7 in_register_00000089;
  bool bVar25;
  pointer pTVar26;
  ulong uVar27;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __first;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __last;
  ulong uVar28;
  TempOpening *opening;
  long lVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> in;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> nors;
  aiVector3t<double> res;
  shared_ptr<Assimp::IFC::TempMesh> profile2D;
  shared_ptr<Assimp::IFC::TempMesh> profile;
  TempMesh temp;
  IfcMatrix4 trafo;
  IfcVector3 profileNormal;
  byte local_25c;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_258;
  ConversionData *local_240;
  double local_238;
  undefined4 local_230;
  uint local_22c;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_228;
  IfcVector3 local_208;
  TempMesh *local_1f0;
  TempOpening local_1e8;
  double local_188;
  double dStack_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_170;
  TempMesh *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  TempMesh *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  TempMesh local_148;
  IfcMatrix4 local_118;
  IfcExtrudedAreaSolid *local_90;
  double local_88;
  double dStack_80;
  double local_78;
  IfcExtrudedAreaSolid *local_68;
  double dStack_60;
  double local_58;
  IfcVector3 local_48;
  
  local_240 = conv;
  pIVar13 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProfileDef>
                      (*(LazyObject **)
                        &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
  iVar11 = std::__cxx11::string::compare
                     (&(pIVar13->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                       field_0x10);
  local_230 = (undefined4)CONCAT71(in_register_00000089,collect_openings);
  if (iVar11 == 0) {
    lVar23 = (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar15 = lVar23 / 0x18;
    if (solid->Depth <= 1e-06 && solid->Depth != 1e-06) {
      if (uVar15 < 3) {
        return;
      }
      TempMesh::Append(result,curve);
      return;
    }
    local_22c = (uint)(2 < uVar15);
    bVar17 = 2 - (uVar15 < 3);
  }
  else {
    if (solid->Depth <= 1e-06 && solid->Depth != 1e-06) {
      return;
    }
    lVar23 = (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    bVar17 = 1;
    local_22c = 0;
  }
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&result->mVerts,(lVar23 >> 3) * -0x5555555555555555 << (bVar17 & 0x3f));
  local_170 = &result->mVertcnt;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&result->mVertcnt,
             ((long)(curve->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(curve->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 2);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
            (&local_258,&curve->mVerts);
  local_118.a1 = 1.0;
  local_118.a2 = 0.0;
  local_118.a3 = 0.0;
  local_118.a4 = 0.0;
  local_118.b1 = 0.0;
  local_118.b2 = 1.0;
  local_118.b3 = 0.0;
  local_118.b4 = 0.0;
  local_118.c1 = 0.0;
  local_118.c2 = 0.0;
  local_118.c3 = 1.0;
  local_118.c4 = 0.0;
  local_118.d1 = 0.0;
  local_118.d2 = 0.0;
  local_118.d3 = 0.0;
  local_118.d4 = 1.0;
  in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                    ((solid->super_IfcSweptAreaSolid).Position.obj);
  ConvertAxisPlacement(&local_118,in_00);
  if (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start ==
      local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    local_188 = -20000000000.0;
    dStack_180 = -20000000000.0;
    local_238 = -20000000000.0;
    paVar16 = local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    paVar16 = local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar35 = _DAT_00734830;
    auVar39 = _DAT_00734820;
    dVar30 = -10000000000.0;
    dVar2 = 10000000000.0;
    do {
      dVar32 = ((IfcVector3 *)&paVar16->x)->x;
      dVar31 = paVar16->y;
      dVar33 = paVar16->z;
      local_238 = local_118.c3 * dVar33 + local_118.c1 * dVar32 + local_118.c2 * dVar31 +
                  local_118.c4;
      paVar16->z = local_238;
      dVar36 = local_238;
      if (dVar2 <= local_238) {
        dVar36 = dVar2;
      }
      auVar38._0_8_ =
           dVar33 * local_118.a3 + dVar32 * local_118.a1 + dVar31 * local_118.a2 + local_118.a4;
      auVar38._8_8_ =
           dVar33 * local_118.b3 + dVar32 * local_118.b1 + dVar31 * local_118.b2 + local_118.b4;
      paVar16->x = auVar38._0_8_;
      paVar16->y = auVar38._8_8_;
      auVar34._8_8_ = auVar38._8_8_;
      auVar34._0_8_ = auVar38._0_8_;
      auVar35 = minpd(auVar34,auVar35);
      auVar39 = maxpd(auVar38,auVar39);
      if (local_238 <= dVar30) {
        local_238 = dVar30;
      }
      paVar16 = paVar16 + 1;
      dVar30 = local_238;
      dVar2 = dVar36;
    } while (paVar16 !=
             local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    local_188 = auVar39._0_8_ - auVar35._0_8_;
    dStack_180 = auVar39._8_8_ - auVar35._8_8_;
    local_238 = local_238 - dVar36;
    paVar16 = local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  dVar2 = extrusionDir->x;
  dVar30 = extrusionDir->y;
  dVar32 = extrusionDir->z;
  local_208.x = dVar32 * local_118.a3 + dVar2 * local_118.a1 + dVar30 * local_118.a2;
  local_208.y = dVar32 * local_118.b3 + dVar2 * local_118.b1 + dVar30 * local_118.b2;
  local_208.z = dVar32 * local_118.c3 + dVar2 * local_118.c1 + dVar30 * local_118.c2;
  TempMesh::ComputePolygonNormal
            (&local_48,
             local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             ((long)paVar16 -
              (long)local_258.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,true);
  if ((local_48.z * local_208.z + local_48.x * local_208.x + local_48.y * local_208.y < 0.0) &&
     (pIVar19 = local_258.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish + -1,
     pIVar8 = local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
     local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
     super__Vector_impl_data._M_start < pIVar19 &&
     local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
     super__Vector_impl_data._M_start !=
     local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    do {
      pIVar14 = pIVar8 + 1;
      local_1e8.extrusionDir.y = pIVar8->z;
      local_1e8.solid = (IfcSolidModel *)((IfcVector3 *)&pIVar8->x)->x;
      local_1e8.extrusionDir.x = pIVar8->y;
      pIVar8->z = pIVar19->z;
      dVar2 = pIVar19->y;
      ((IfcVector3 *)&pIVar8->x)->x = ((IfcVector3 *)&pIVar19->x)->x;
      pIVar8->y = dVar2;
      pIVar19->z = local_1e8.extrusionDir.y;
      ((IfcVector3 *)&pIVar19->x)->x = (double)local_1e8.solid;
      pIVar19->y = local_1e8.extrusionDir.x;
      pIVar19 = pIVar19 + -1;
      pIVar8 = pIVar14;
    } while (pIVar14 < pIVar19);
  }
  ppaVar22 = &(result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_finish;
  ppaVar21 = &(result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<double> *)0x0;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<double> *)0x0;
  pvVar3 = local_240->apply_openings;
  local_90 = solid;
  local_1f0 = result;
  if (pvVar3 == (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0)
  {
    local_25c = 0;
  }
  else {
    __first._M_current =
         (pvVar3->
         super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>).
         _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (pvVar3->
         super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if ((long)__last._M_current - (long)__first._M_current == 0) {
      local_25c = 0;
    }
    else {
      if (local_240->settings->useCustomTriangulation == false) {
        local_1e8.solid =
             (IfcSolidModel *)
             ((IfcVector3 *)
             &(local_258.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start)->x)->x;
        local_1e8.extrusionDir.x =
             (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->y;
        local_1e8.extrusionDir.y =
             (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->z;
        __comp_00.x = (local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x;
        __comp_00.y = (local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->y;
        __comp_00.z = (local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z;
        uVar15 = ((long)__last._M_current - (long)__first._M_current >> 3) * 0x2e8ba2e8ba2e8ba3;
        lVar23 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar23 == 0; lVar23 = lVar23 + -1) {
          }
        }
        local_68 = (IfcExtrudedAreaSolid *)local_1e8.solid;
        dStack_60 = local_1e8.extrusionDir.x;
        local_58 = local_1e8.extrusionDir.y;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>>
                  (__first,__last,(ulong)(((uint)lVar23 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>)__comp_00);
        __comp._M_comp.base.y = local_1e8.extrusionDir.x;
        __comp._M_comp.base.x = (double)local_1e8.solid;
        __comp._M_comp.base.z = local_1e8.extrusionDir.y;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>>
                  (__first,__last,__comp);
        __first._M_current =
             (local_240->apply_openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (local_240->apply_openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&local_228,
                 ((long)__last._M_current - (long)__first._M_current >> 3) * 0x2e8ba2e8ba2e8ba3);
      local_170 = &local_148.mVertcnt;
      ppaVar22 = &local_148.mVerts.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      ppaVar21 = &local_148.mVerts.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      pTVar26 = (local_240->apply_openings->
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (local_240->apply_openings->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      result = &local_148;
      local_25c = 1;
      if (pTVar26 != pTVar4) {
        do {
          peVar5 = (pTVar26->profileMesh).
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pdVar6 = &((peVar5->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->x;
          if ((ulong)(((long)(peVar5->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) *
                     -0x5555555555555555) < 3) {
            local_1e8.solid = (IfcSolidModel *)0x0;
            local_1e8.extrusionDir.x = 0.0;
            local_1e8.extrusionDir.y = 0.0;
            if (local_228.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_228.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_228
                         ,(iterator)
                          local_228.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                         (aiVector3t<double> *)&local_1e8);
            }
            else {
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = 0.0;
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = 0.0;
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = 0.0;
LAB_005b57d0:
              local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_228.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            dVar2 = pdVar6[6] - *pdVar6;
            dVar33 = pdVar6[7] - pdVar6[1];
            dVar32 = pdVar6[8] - pdVar6[2];
            dVar31 = pdVar6[4] - pdVar6[1];
            dVar36 = pdVar6[5] - pdVar6[2];
            dVar37 = pdVar6[3] - *pdVar6;
            dVar30 = dVar33 * dVar36 - dVar31 * dVar32;
            dVar32 = dVar32 * dVar37 - dVar36 * dVar2;
            local_1e8.extrusionDir.y = dVar2 * dVar31 - dVar37 * dVar33;
            local_1e8.extrusionDir.x =
                 1.0 / SQRT(local_1e8.extrusionDir.y * local_1e8.extrusionDir.y +
                            dVar30 * dVar30 + dVar32 * dVar32);
            local_1e8.extrusionDir.y = local_1e8.extrusionDir.y * local_1e8.extrusionDir.x;
            local_1e8.solid = (IfcSolidModel *)(local_1e8.extrusionDir.x * dVar30);
            local_1e8.extrusionDir.x = local_1e8.extrusionDir.x * dVar32;
            if (local_228.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                local_228.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = local_1e8.extrusionDir.y;
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = (double)local_1e8.solid;
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = local_1e8.extrusionDir.x;
              goto LAB_005b57d0;
            }
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_228,
                       (iterator)
                       local_228.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(aiVector3t<double> *)&local_1e8);
          }
          pTVar26 = pTVar26 + 1;
        } while (pTVar26 != pTVar4);
      }
    }
  }
  local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((long)local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    local_238 = (double)((ulong)local_238 & 0xffffffff00000000);
  }
  else {
    local_188 = SQRT(local_238 * local_238 + local_188 * local_188 + dStack_180 * dStack_180) * 0.1;
    uVar15 = ((long)local_258.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_258.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar23 = 0;
    local_238 = 0.0;
    uVar28 = 0;
    do {
      uVar28 = uVar28 + 1;
      uVar27 = uVar28;
      if (uVar28 == uVar15) {
        uVar27 = 0;
      }
      local_1e8.solid = (IfcSolidModel *)CONCAT44(local_1e8.solid._4_4_,4);
      iVar7._M_current =
           (local_170->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (local_170->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (local_170,iVar7,(uint *)&local_1e8);
      }
      else {
        *iVar7._M_current = 4;
        ppuVar1 = &(local_170->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      paVar20 = (aiVector3t<double> *)
                ((long)&((IfcVector3 *)
                        &(local_258.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar23);
      iVar24._M_current = *ppaVar22;
      if (iVar24._M_current == *ppaVar21) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>const&>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar24,
                   paVar20);
        iVar24._M_current = *ppaVar22;
      }
      else {
        (iVar24._M_current)->z = paVar20->z;
        dVar2 = paVar20->y;
        (iVar24._M_current)->x = paVar20->x;
        (iVar24._M_current)->y = dVar2;
        iVar24._M_current = *ppaVar22 + 1;
        *ppaVar22 = iVar24._M_current;
      }
      paVar20 = local_258.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start + uVar27;
      if (iVar24._M_current == *ppaVar21) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>const&>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar24,
                   paVar20);
        iVar24._M_current = *ppaVar22;
      }
      else {
        (iVar24._M_current)->z = paVar20->z;
        dVar2 = paVar20->y;
        (iVar24._M_current)->x = paVar20->x;
        (iVar24._M_current)->y = dVar2;
        iVar24._M_current = *ppaVar22 + 1;
        *ppaVar22 = iVar24._M_current;
      }
      local_1e8.extrusionDir.y =
           local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar27].z + local_208.z;
      local_1e8.solid =
           (IfcSolidModel *)
           (((IfcVector3 *)
            &local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar27].x)->x + local_208.x);
      local_1e8.extrusionDir.x =
           local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar27].y + local_208.y;
      if (iVar24._M_current == *ppaVar21) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar24,
                   (aiVector3t<double> *)&local_1e8);
        iVar24._M_current = *ppaVar22;
      }
      else {
        (iVar24._M_current)->z = local_1e8.extrusionDir.y;
        (iVar24._M_current)->x = (double)local_1e8.solid;
        (iVar24._M_current)->y = local_1e8.extrusionDir.x;
        iVar24._M_current = *ppaVar22 + 1;
        *ppaVar22 = iVar24._M_current;
      }
      local_1e8.extrusionDir.y =
           *(double *)
            ((long)&(local_258.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->z + lVar23) + local_208.z;
      pdVar6 = (double *)
               ((long)&((IfcVector3 *)
                       &(local_258.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar23);
      local_1e8.solid = (IfcSolidModel *)(*pdVar6 + local_208.x);
      local_1e8.extrusionDir.x = pdVar6[1] + local_208.y;
      if (iVar24._M_current == *ppaVar21) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar24,
                   (aiVector3t<double> *)&local_1e8);
      }
      else {
        (iVar24._M_current)->z = local_1e8.extrusionDir.y;
        (iVar24._M_current)->x = (double)local_1e8.solid;
        (iVar24._M_current)->y = local_1e8.extrusionDir.x;
        *ppaVar22 = *ppaVar22 + 1;
      }
      if (local_25c != 0) {
        dVar2 = *(double *)
                 ((long)&((IfcVector3 *)
                         &(local_258.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar23) -
                ((IfcVector3 *)
                &local_258.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar27].x)->x;
        dVar30 = *(double *)
                  ((long)&(local_258.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->y + lVar23) -
                 local_258.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar27].y;
        dVar32 = *(double *)
                  ((long)&(local_258.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->z + lVar23) -
                 local_258.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar27].z;
        if (local_188 < SQRT(dVar32 * dVar32 + dVar2 * dVar2 + dVar30 * dVar30)) {
          bVar10 = GenerateOpenings(local_240->apply_openings,&local_228,&local_148,true,true,
                                    &local_208);
          local_238 = (double)((long)local_238 + (ulong)bVar10);
        }
        TempMesh::Append(local_1f0,&local_148);
        TempMesh::Clear(&local_148);
      }
      uVar15 = ((long)local_258.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_258.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar23 = lVar23 + 0x18;
    } while (uVar28 < uVar15);
    local_238 = (double)CONCAT44(local_238._4_4_,
                                 (int)CONCAT71((int7)(uVar15 >> 8),
                                               local_238 == 4.94065645841247e-324));
  }
  if (local_25c != 0) {
    pTVar4 = (local_240->apply_openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pTVar26 = (local_240->apply_openings->
                   super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                   )._M_impl.super__Vector_impl_data._M_start; pTVar26 != pTVar4;
        pTVar26 = pTVar26 + 1) {
      if ((pTVar26->wallPoints).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pTVar26->wallPoints).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5b5b78);
        paVar16 = (pTVar26->wallPoints).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pTVar26->wallPoints).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish != paVar16) {
          (pTVar26->wallPoints).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish = paVar16;
        }
      }
    }
  }
  if ((char)local_22c == '\0') {
    bVar10 = false;
  }
  else {
    bVar18 = false;
    local_188 = 0.0;
    bVar10 = true;
    do {
      bVar25 = bVar10;
      paVar16 = local_258.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish;
      if (bVar18) {
        if (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar23 = 0x10;
          uVar15 = 0;
          do {
            local_1e8.extrusionDir.y =
                 *(double *)
                  ((long)&((IfcVector3 *)
                          &(local_258.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar23) +
                 local_208.z;
            pdVar6 = (double *)
                     ((long)local_258.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar23 + -0x10);
            local_1e8.solid = (IfcSolidModel *)(*pdVar6 + local_208.x);
            local_1e8.extrusionDir.x = pdVar6[1] + local_208.y;
            iVar24._M_current = *ppaVar22;
            if (iVar24._M_current == *ppaVar21) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar24,(aiVector3t<double> *)&local_1e8);
            }
            else {
              (iVar24._M_current)->z = local_1e8.extrusionDir.y;
              (iVar24._M_current)->x = (double)local_1e8.solid;
              (iVar24._M_current)->y = local_1e8.extrusionDir.x;
              *ppaVar22 = *ppaVar22 + 1;
            }
            uVar15 = uVar15 + 1;
            lVar23 = lVar23 + 0x18;
            paVar16 = local_258.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar15 < (ulong)(((long)local_258.
                                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_258.
                                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555));
        }
      }
      else {
        lVar23 = (long)local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (lVar23 != 0) {
          lVar29 = (lVar23 >> 3) * -0x5555555555555555;
          do {
            paVar20 = (aiVector3t<double> *)
                      ((long)&((IfcVector3 *)
                              &local_258.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].x)->x + lVar23);
            iVar24._M_current = *ppaVar22;
            if (iVar24._M_current == *ppaVar21) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar24,paVar20);
            }
            else {
              (iVar24._M_current)->z = paVar20->z;
              dVar2 = paVar20->y;
              (iVar24._M_current)->x = paVar20->x;
              (iVar24._M_current)->y = dVar2;
              *ppaVar22 = *ppaVar22 + 1;
            }
            lVar29 = lVar29 + -1;
            paVar16 = local_258.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar23 = lVar23 + -0x18;
          } while (lVar29 != 0);
        }
      }
      uVar12 = (int)((ulong)((long)local_258.
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar16) >> 3)
               * -0x55555555;
      local_1e8.solid = (IfcSolidModel *)CONCAT44(local_1e8.solid._4_4_,uVar12);
      iVar7._M_current =
           (local_170->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (local_170->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (local_170,iVar7,(uint *)&local_1e8);
      }
      else {
        *iVar7._M_current = uVar12;
        ppuVar1 = &(local_170->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      if ((local_25c != 0) &&
         (2 < (ulong)(((long)local_258.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_258.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))
         ) {
        bVar10 = GenerateOpenings(local_240->apply_openings,&local_228,&local_148,true,true,
                                  &local_208);
        TempMesh::Append(local_1f0,&local_148);
        TempMesh::Clear(&local_148);
        local_188 = (double)((long)local_188 + (ulong)bVar10);
      }
      bVar18 = true;
      bVar10 = false;
    } while (bVar25);
    bVar10 = local_188 == 9.88131291682493e-324;
  }
  other = local_1f0;
  uVar9 = local_230;
  if ((local_25c & (SUB81(local_238,0) | bVar10)) == 1) {
    LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5b5dea);
  }
  LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5b5df6);
  if (((char)uVar9 != '\0') &&
     (((other->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       (other->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish ||
      ((other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    if (local_240->collect_openings ==
        (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0) {
      __assert_fail("conv.collect_openings",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCGeometry.cpp"
                    ,0x29b,
                    "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                   );
    }
    local_158 = (TempMesh *)operator_new(0x30);
    (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_158->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_158->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_158->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
              (&local_150,local_158);
    TempMesh::Swap(local_158,other);
    local_168 = (TempMesh *)operator_new(0x30);
    (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_168->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_168->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_168->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
              (&local_160,local_168);
    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)local_168,
               (local_168->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish,
               local_258.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_258.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish);
    uVar12 = (int)((ulong)((long)local_258.
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_258.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    local_1e8.solid = (IfcSolidModel *)CONCAT44(local_1e8.solid._4_4_,uVar12);
    iVar7._M_current =
         (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_168->mVertcnt,iVar7,(uint *)&local_1e8);
    }
    else {
      *iVar7._M_current = uVar12;
      ppuVar1 = &(local_168->mVertcnt).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    this_00._M_pi = local_150._M_pi;
    this._M_pi = local_160._M_pi;
    pvVar3 = local_240->collect_openings;
    local_88 = local_208.x;
    dStack_80 = local_208.y;
    local_78 = local_208.z;
    if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
      }
    }
    if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
      }
    }
    local_1e8.extrusionDir.z = local_208.z;
    local_1e8.extrusionDir.x = local_208.x;
    local_1e8.extrusionDir.y = local_208.y;
    local_1e8.solid = (IfcSolidModel *)local_90;
    local_1e8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_158;
    local_1e8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_150._M_pi;
    if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
      }
    }
    local_1e8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_168;
    local_1e8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_160._M_pi;
    if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
      }
    }
    local_1e8.wallPoints.
    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.wallPoints.
    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.wallPoints.
    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
    emplace_back<Assimp::IFC::TempOpening>(pvVar3,&local_1e8);
    if (local_1e8.wallPoints.
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.wallPoints.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1e8.profileMesh2D.
        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.profileMesh2D.
                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1e8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.profileMesh.
                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    if (((other->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (other->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       ((other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      __assert_fail("result.IsEmpty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCGeometry.cpp"
                    ,0x2a4,
                    "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                   );
    }
    if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
    }
    if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
    }
  }
  if (local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.mVertcnt.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.mVerts.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (IfcVector3 *)0x0) {
    operator_delete(local_258.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid& solid, const TempMesh& curve,
    const IfcVector3& extrusionDir, TempMesh& result, ConversionData &conv, bool collect_openings)
{
    // Outline: 'curve' is now a list of vertex points forming the underlying profile, extrude along the given axis,
    // forming new triangles.
    const bool has_area = solid.SweptArea->ProfileType == "AREA" && curve.mVerts.size() > 2;
    if( solid.Depth < 1e-6 ) {
        if( has_area ) {
            result.Append(curve);
        }
        return;
    }

    result.mVerts.reserve(curve.mVerts.size()*(has_area ? 4 : 2));
    result.mVertcnt.reserve(curve.mVerts.size() + 2);
    std::vector<IfcVector3> in = curve.mVerts;

    // First step: transform all vertices into the target coordinate space
    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);
    for(IfcVector3& v : in) {
        v *= trafo;

        vmin = std::min(vmin, v);
        vmax = std::max(vmax, v);
    }

    vmax -= vmin;
    const IfcFloat diag = vmax.Length();
    IfcVector3 dir = IfcMatrix3(trafo) * extrusionDir;

    // reverse profile polygon if it's winded in the wrong direction in relation to the extrusion direction
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(in.data(), in.size());
    if( profileNormal * dir < 0.0 )
        std::reverse(in.begin(), in.end());

    std::vector<IfcVector3> nors;
    const bool openings = !!conv.apply_openings && conv.apply_openings->size();

    // Compute the normal vectors for all opening polygons as a prerequisite
    // to TryAddOpenings_Poly2Tri()
    // XXX this belongs into the aforementioned function
    if( openings ) {

        if( !conv.settings.useCustomTriangulation ) {
            // it is essential to apply the openings in the correct spatial order. The direction
            // doesn't matter, but we would screw up if we started with e.g. a door in between
            // two windows.
            std::sort(conv.apply_openings->begin(), conv.apply_openings->end(), TempOpening::DistanceSorter(in[0]));
        }

        nors.reserve(conv.apply_openings->size());
        for(TempOpening& t : *conv.apply_openings) {
            TempMesh& bounds = *t.profileMesh.get();

            if( bounds.mVerts.size() <= 2 ) {
                nors.push_back(IfcVector3());
                continue;
            }
            nors.push_back(((bounds.mVerts[2] - bounds.mVerts[0]) ^ (bounds.mVerts[1] - bounds.mVerts[0])).Normalize());
        }
    }


    TempMesh temp;
    TempMesh& curmesh = openings ? temp : result;
    std::vector<IfcVector3>& out = curmesh.mVerts;

    size_t sides_with_openings = 0;
    for( size_t i = 0; i < in.size(); ++i ) {
        const size_t next = (i + 1) % in.size();

        curmesh.mVertcnt.push_back(4);

        out.push_back(in[i]);
        out.push_back(in[next]);
        out.push_back(in[next] + dir);
        out.push_back(in[i] + dir);

        if( openings ) {
            if( (in[i] - in[next]).Length() > diag * 0.1 && GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                ++sides_with_openings;
            }

            result.Append(temp);
            temp.Clear();
        }
    }

    if( openings ) {
        for(TempOpening& opening : *conv.apply_openings) {
            if( !opening.wallPoints.empty() ) {
                IFCImporter::LogError("failed to generate all window caps");
            }
            opening.wallPoints.clear();
        }
    }

    size_t sides_with_v_openings = 0;
    if( has_area ) {

        for( size_t n = 0; n < 2; ++n ) {
            if( n > 0 ) {
                for( size_t i = 0; i < in.size(); ++i )
                    out.push_back(in[i] + dir);
            }
            else {
                for( size_t i = in.size(); i--; )
                    out.push_back(in[i]);
            }

            curmesh.mVertcnt.push_back(static_cast<unsigned int>(in.size()));
            if( openings && in.size() > 2 ) {
                if( GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                    ++sides_with_v_openings;
                }

                result.Append(temp);
                temp.Clear();
            }
        }
    }

    if( openings && ((sides_with_openings == 1 && sides_with_openings) || (sides_with_v_openings == 2 && sides_with_v_openings)) ) {
        IFCImporter::LogWarn("failed to resolve all openings, presumably their topology is not supported by Assimp");
    }

    IFCImporter::LogDebug("generate mesh procedurally by extrusion (IfcExtrudedAreaSolid)");

    // If this is an opening element, store both the extruded mesh and the 2D profile mesh
    // it was created from. Return an empty mesh to the caller.
    if( collect_openings && !result.IsEmpty() ) {
        ai_assert(conv.collect_openings);
        std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
        profile->Swap(result);

        std::shared_ptr<TempMesh> profile2D = std::shared_ptr<TempMesh>(new TempMesh());
        profile2D->mVerts.insert(profile2D->mVerts.end(), in.begin(), in.end());
        profile2D->mVertcnt.push_back(static_cast<unsigned int>(in.size()));
        conv.collect_openings->push_back(TempOpening(&solid, dir, profile, profile2D));

        ai_assert(result.IsEmpty());
    }
}